

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

Instr * __thiscall
LinearScan::GeneratorBailIn::GenerateBailIn(GeneratorBailIn *this,GeneratorBailInInstr *bailInInstr)

{
  Instr *insertBeforeInstr;
  RegOpnd *dst;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  BailOutInfo *pBVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  SymOpnd *src;
  IndirOpnd *pIVar6;
  Opnd *dst_00;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  CapturedValues *pCVar7;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses;
  Instr *insertBailInTraceBefore;
  undefined1 local_48 [8];
  BailInInsertionPoint insertionPoint;
  
  pBVar3 = IR::Instr::GetBailOutInfo(bailInInstr->yieldInstr);
  pCVar7 = pBVar3->capturedValues;
  if ((pCVar7 != (CapturedValues *)0x0) &&
     ((CapturedValues *)(pCVar7->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      pCVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1394,
                       "(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty())"
                       ,
                       "!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty()"
                      );
    if (!bVar2) goto LAB_00588505;
    *puVar4 = 0;
  }
  pCVar7 = pBVar3->capturedValues;
  if ((pCVar7 != (CapturedValues *)0x0) &&
     ((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *)
      (pCVar7->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next !=
      &pCVar7->copyPropSyms)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1395,
                       "(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty())"
                       ,
                       "!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty()"
                      );
    if (!bVar2) goto LAB_00588505;
    *puVar4 = 0;
  }
  pBVar5 = pBVar3->liveLosslessInt32Syms;
  if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    do {
      pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)pBVar5->head;
      if (pBVar5 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0058829c;
    } while (((Type *)&pBVar5->alloc)->word == 0);
    if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1396,
                         "(!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty())"
                         ,
                         "!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty()"
                        );
      if (!bVar2) goto LAB_00588505;
      *puVar4 = 0;
    }
  }
LAB_0058829c:
  pBVar5 = pBVar3->liveFloat64Syms;
  if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    do {
      pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)pBVar5->head;
      if (pBVar5 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0058830f;
    } while (((Type *)&pBVar5->alloc)->word == 0);
    if (pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x1397,
                         "(!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty())"
                         ,"!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty()"
                        );
      if (!bVar2) goto LAB_00588505;
      *puVar4 = 0;
    }
  }
LAB_0058830f:
  insertBeforeInstr = (bailInInstr->super_LabelInstr).super_Instr.m_next;
  dst = this->interpreterFrameRegOpnd;
  src = CreateGeneratorObjectOpnd(this);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr);
  pIVar6 = IR::IndirOpnd::New(this->interpreterFrameRegOpnd,0x20,TyUint64,this->func,false);
  InsertMove(&this->interpreterFrameRegOpnd->super_Opnd,&pIVar6->super_Opnd,insertBeforeInstr);
  bVar2 = Func::HasArgumentSlot(this->func);
  if (bVar2) {
    pIVar6 = IR::IndirOpnd::New(this->interpreterFrameRegOpnd,0x40,TyUint64,this->func,false);
    InsertMove(&this->tempRegOpnd->super_Opnd,&pIVar6->super_Opnd,insertBeforeInstr);
    dst_00 = LowererMD::CreateStackArgumentsSlotOpnd(this->func);
    InsertMove(dst_00,&this->tempRegOpnd->super_Opnd,insertBeforeInstr);
  }
  local_48 = (undefined1  [8])0x0;
  pBVar5 = pBVar3->byteCodeUpwardExposedUsed;
  pCVar7 = &bailInInstr->capturedValues;
  insertionPoint.raxRestoreInstr = insertBeforeInstr;
  insertionPoint.instrInsertStackSym = insertBeforeInstr;
  BuildBailInSymbolList(this,pBVar5,&bailInInstr->upwardExposedUses,pCVar7);
  InsertRestoreSymbols(this,pBVar5,upwardExposedUses,pCVar7,(BailInInsertionPoint *)local_48);
  bVar2 = Func::IsStackArgsEnabled(this->func);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13c5,"(!this->func->IsStackArgsEnabled())",
                       "!this->func->IsStackArgsEnabled()");
    if (!bVar2) goto LAB_00588505;
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,BailInPhase,sourceContextId,functionId);
  if (bVar2) {
    if (insertBeforeInstr->m_opcode != GeneratorOutputBailInTraceLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x13cb,
                         "(insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel)"
                         ,
                         "insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel"
                        );
      if (!bVar2) {
LAB_00588505:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    InsertBailInTrace(this,pBVar3->byteCodeUpwardExposedUsed,insertBeforeInstr->m_next);
  }
  return insertBeforeInstr;
}

Assistant:

IR::Instr* LinearScan::GeneratorBailIn::GenerateBailIn(IR::GeneratorBailInInstr* bailInInstr)
{
    BailOutInfo* bailOutInfo = bailInInstr->yieldInstr->GetBailOutInfo();

    Assert(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty());
    Assert(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty());
    Assert(!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty());
    Assert(!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty());

    IR::Instr* instrAfter = bailInInstr->m_next;

    // 1) Load the generator object that was passed as one of the arguments to the jitted frame
    LinearScan::InsertMove(this->interpreterFrameRegOpnd, this->CreateGeneratorObjectOpnd(), instrAfter);

    // 2) Gets the InterpreterStackFrame pointer into rax
    IR::IndirOpnd* generatorFrameOpnd = IR::IndirOpnd::New(this->interpreterFrameRegOpnd, Js::JavascriptGenerator::GetFrameOffset(), TyMachPtr, this->func);
    LinearScan::InsertMove(this->interpreterFrameRegOpnd, generatorFrameOpnd, instrAfter);

    // 3) Put the Javascript's `arguments` object, which is stored in the interpreter frame, to the jit's stack slot if needed
    //    See BailOutRecord::RestoreValues
    if (this->func->HasArgumentSlot())
    {
        IR::IndirOpnd* generatorArgumentsOpnd = IR::IndirOpnd::New(this->interpreterFrameRegOpnd, Js::InterpreterStackFrame::GetOffsetOfArguments(), TyMachPtr, this->func);
        LinearScan::InsertMove(this->tempRegOpnd, generatorArgumentsOpnd, instrAfter);
        LinearScan::InsertMove(LowererMD::CreateStackArgumentsSlotOpnd(this->func), this->tempRegOpnd, instrAfter);
    }

    BailInInsertionPoint insertionPoint
    {
        nullptr,    /* raxRestoreInstr */
        instrAfter, /* instrInsertStackSym */
        instrAfter  /* instrInsertRegSym */
    };

    // 4) Restore symbols
    // - We don't need to restore argObjSyms because StackArgs is currently not enabled
    //   Commented out here in case we do want to enable it in the future:
    // this->InsertRestoreSymbols(bailOutInfo->capturedValues->argObjSyms, insertionPoint, saveInitializedReg);
    // 
    // - We move all argout symbols right before the call so we don't need to restore argouts either

    this->BuildBailInSymbolList(
        *bailOutInfo->byteCodeUpwardExposedUsed,
        bailInInstr->upwardExposedUses,
        bailInInstr->capturedValues
    );

    this->InsertRestoreSymbols(
        *bailOutInfo->byteCodeUpwardExposedUsed,
        bailInInstr->upwardExposedUses,
        bailInInstr->capturedValues,
        insertionPoint
    );
    Assert(!this->func->IsStackArgsEnabled());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TRACE(Js::Phase::BailInPhase, this->func))
    {
        IR::Instr* insertBailInTraceBefore = instrAfter;
        Assert(insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel);
        this->InsertBailInTrace(bailOutInfo->byteCodeUpwardExposedUsed, insertBailInTraceBefore->m_next);
    }
#endif

    return instrAfter;
}